

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O2

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::CameraParameters::generateCameraRays
          (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,CameraParameters *this,size_t dimX,size_t dimY,ImageOrigin origin
          )

{
  undefined8 uVar1;
  pointer pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  size_t iX;
  size_t sVar7;
  long lVar8;
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_XMM3 [16];
  vec3 vVar12;
  vec<3,_float,_(glm::qualifier)0> vVar13;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  long local_108;
  long local_100;
  size_t local_f8;
  long local_f0;
  vec<3,_float,_(glm::qualifier)0> local_e8;
  undefined1 local_d8 [16];
  vec<4,_float,_(glm::qualifier)0> local_c8;
  mat4x4 viewMat;
  mat4 projMat;
  
  viewMat.value[0].field_0 = (this->extrinsics).E.value[0].field_0;
  viewMat.value[0].field_1 = (this->extrinsics).E.value[0].field_1;
  viewMat.value[0].field_2 = (this->extrinsics).E.value[0].field_2;
  viewMat.value[0].field_3 = (this->extrinsics).E.value[0].field_3;
  viewMat.value[1].field_0 = (this->extrinsics).E.value[1].field_0;
  viewMat.value[1].field_1 = (this->extrinsics).E.value[1].field_1;
  viewMat.value[1].field_2 = (this->extrinsics).E.value[1].field_2;
  viewMat.value[1].field_3 = (this->extrinsics).E.value[1].field_3;
  viewMat.value[2].field_0 = (this->extrinsics).E.value[2].field_0;
  viewMat.value[2].field_1 = (this->extrinsics).E.value[2].field_1;
  viewMat.value[2].field_2 = (this->extrinsics).E.value[2].field_2;
  viewMat.value[2].field_3 = (this->extrinsics).E.value[2].field_3;
  viewMat.value[3].field_0 = (this->extrinsics).E.value[3].field_0;
  viewMat.value[3].field_1 = (this->extrinsics).E.value[3].field_1;
  viewMat.value[3].field_2 = (this->extrinsics).E.value[3].field_2;
  viewMat.value[3].field_3 = (this->extrinsics).E.value[3].field_3;
  glm::infinitePerspectiveRH<float>
            (&projMat,(this->intrinsics).fovVerticalDegrees * 0.017453292,
             (this->intrinsics).aspectRatioWidthOverHeight,1.0);
  auVar3 = vcvtusi2ss_avx512f(in_XMM3,dimX);
  local_c8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_c8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_c8.field_2 = auVar3._0_4_;
  auVar3 = vcvtusi2ss_avx512f(in_XMM3,dimY);
  auVar11 = ZEXT856(auVar3._8_8_);
  local_c8.field_3 = auVar3._0_4_;
  vVar12 = CameraExtrinsics::getPosition(&this->extrinsics);
  auVar9._0_8_ = vVar12._0_8_;
  auVar9._8_56_ = auVar11;
  local_d8 = auVar9._0_16_;
  local_f8 = dimY;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(__return_storage_ptr__,dimY * dimX,(allocator_type *)&local_114);
  local_100 = dimX * 0xc;
  lVar6 = 8;
  for (local_108 = 0; lVar8 = local_f8 - local_108, lVar8 != 0; local_108 = local_108 + 1) {
    sVar7 = 0;
    local_f0 = lVar6;
    while (auVar11 = auVar9._8_56_, dimX != sVar7) {
      lVar5 = lVar8;
      if ((origin == UpperLeft) || (lVar5 = local_108, origin == LowerLeft)) {
        auVar3 = vcvtusi2ss_avx512f(in_XMM3,lVar5);
        auVar11 = ZEXT856(auVar3._8_8_);
        auVar4 = vcvtusi2ss_avx512f(in_XMM3,sVar7);
        local_114 = auVar4._0_4_;
        local_110 = auVar3._0_4_;
        local_10c = 0;
      }
      vVar13 = glm::unProjectNO<float,float,(glm::qualifier)0>
                         ((vec<3,_float,_(glm::qualifier)0> *)&local_114,&viewMat,&projMat,&local_c8
                         );
      auVar10._0_8_ = vVar13._0_8_;
      auVar10._8_56_ = auVar11;
      auVar3 = vsubps_avx(auVar10._0_16_,local_d8);
      auVar11 = ZEXT856(auVar3._8_8_);
      local_e8.field_2.z = vVar13.field_2.z - vVar12.field_2.z;
      local_e8._0_8_ = vmovlps_avx(auVar3);
      vVar13 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_e8);
      auVar9._0_8_ = vVar13._0_8_;
      auVar9._8_56_ = auVar11;
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      sVar7 = sVar7 + 1;
      uVar1 = vmovlps_avx(auVar9._0_16_);
      *(undefined8 *)((long)pvVar2 + lVar6 + -8) = uVar1;
      *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
       ((long)&pvVar2->field_0 + lVar6) = vVar13.field_2;
      lVar6 = lVar6 + 0xc;
    }
    lVar6 = local_f0 + local_100;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<glm::vec3> CameraParameters::generateCameraRays(size_t dimX, size_t dimY, ImageOrigin origin) const {

  // TODO this has not been tested for the case where dimX/dimY do not match the aspectRatio for the cameraParams

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., dimX, dimY};
  glm::vec3 rootPos = getPosition();
  size_t nPix = dimX * dimY;

  // allocate output
  std::vector<glm::vec3> result(dimX * dimY);

  // populate the rays
  for (size_t iY = 0; iY < dimY; iY++) {
    for (size_t iX = 0; iX < dimX; iX++) {

      // populate the rays
      // (this arithmetic could certainly be optimized)

      glm::vec3 screenPos3;
      switch (origin) {
      case ImageOrigin::UpperLeft:
        screenPos3 = glm::vec3{iX, dimY - iY, 0.};
        break;
      case ImageOrigin::LowerLeft:
        screenPos3 = glm::vec3{iX, iY, 0.};
        break;
      }

      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);

      size_t ind = iY * dimX + iX;
      result[ind] = worldRayDir;
    }
  }

  return result;
}